

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::RefAs::finalize(RefAs *this)

{
  RefAsOp RVar1;
  bool bVar2;
  Nullability NVar3;
  HeapType local_50;
  Type local_48;
  HeapType local_40;
  Type local_38;
  uintptr_t local_30;
  Type local_28;
  Type local_20;
  BasicType local_14;
  RefAs *local_10;
  RefAs *this_local;
  
  local_14 = unreachable;
  local_10 = this;
  bVar2 = wasm::Type::operator==(&this->value->type,&local_14);
  if (bVar2) {
    wasm::Type::Type(&local_20,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id =
         local_20.id;
  }
  else {
    RVar1 = this->op;
    if (RVar1 == RefAsNonNull) {
      local_30 = (uintptr_t)wasm::Type::getHeapType(&this->value->type);
      wasm::Type::Type(&local_28,(HeapType)local_30,NonNullable);
      (this->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id =
           local_28.id;
    }
    else if (RVar1 == ExternInternalize) {
      HeapType::HeapType(&local_40,any);
      NVar3 = wasm::Type::getNullability(&this->value->type);
      wasm::Type::Type(&local_38,local_40,NVar3);
      (this->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id =
           local_38.id;
    }
    else {
      if (RVar1 != ExternExternalize) {
        handle_unreachable("invalid ref.as_*",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm.cpp"
                           ,0x47a);
      }
      HeapType::HeapType(&local_50,ext);
      NVar3 = wasm::Type::getNullability(&this->value->type);
      wasm::Type::Type(&local_48,local_50,NVar3);
      (this->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id =
           local_48.id;
    }
  }
  return;
}

Assistant:

void RefAs::finalize() {
  if (value->type == Type::unreachable) {
    type = Type::unreachable;
    return;
  }
  switch (op) {
    case RefAsNonNull:
      type = Type(value->type.getHeapType(), NonNullable);
      break;
    case ExternInternalize:
      type = Type(HeapType::any, value->type.getNullability());
      break;
    case ExternExternalize:
      type = Type(HeapType::ext, value->type.getNullability());
      break;
    default:
      WASM_UNREACHABLE("invalid ref.as_*");
  }
}